

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satelite.cpp
# Opt level: O0

void __thiscall Clasp::SatElite::doExtendModel(SatElite *this,ValueVec *m,LitVec *unconstr)

{
  byte bVar1;
  bool bVar2;
  Clause *this_00;
  bool bVar3;
  ValueRep VVar4;
  ValueRep VVar5;
  byte bVar6;
  Var VVar7;
  Var VVar8;
  uint32 uVar9;
  Literal *pLVar10;
  reference puVar11;
  reference this_01;
  byte *pbVar12;
  iterator pLVar13;
  ulong uVar14;
  pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_> *in_RDX;
  pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_> *in_RSI;
  long in_RDI;
  iterator end_1;
  iterator it;
  iterator j;
  ValueRep vi;
  uint32 end;
  uint32 i;
  Clause *c;
  bool check;
  Var last;
  Literal x;
  Clause *r;
  uint32 us;
  uint32 uv;
  ValueRep value_eliminated;
  Literal *in_stack_ffffffffffffff28;
  Literal *in_stack_ffffffffffffff30;
  Literal *in_stack_ffffffffffffff38;
  pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_> *ppVar15;
  pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_> *in_stack_ffffffffffffff40;
  pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_> *in_stack_ffffffffffffff48;
  undefined7 in_stack_ffffffffffffff50;
  undefined1 uVar16;
  Literal *local_68;
  iterator local_60;
  uint32 local_4c;
  Literal local_34;
  Clause *local_30;
  size_type local_24;
  size_type local_20;
  undefined1 local_19;
  pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_> *local_18;
  pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_> *local_10;
  
  if (*(long *)(in_RDI + 0x28) != 0) {
    local_19 = 4;
    local_20 = 0;
    local_18 = in_RDX;
    local_10 = in_RSI;
    local_24 = bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::size(in_RDX);
    local_30 = *(Clause **)(in_RDI + 0x28);
    do {
      pLVar10 = SatPreprocessor::Clause::operator[](local_30,0);
      local_34.rep_ = pLVar10->rep_;
      VVar7 = Literal::var(&local_34);
      bVar2 = true;
      bVar3 = SatPreprocessor::Clause::marked(local_30);
      if (!bVar3) {
        puVar11 = bk_lib::pod_vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                            ((pod_vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_10,
                             VVar7);
        *puVar11 = '\x04';
      }
      if (local_20 != local_24) {
        this_01 = bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::operator[]
                            (local_18,local_20);
        VVar8 = Literal::var(this_01);
        if (VVar8 == VVar7) {
          bVar2 = false;
          bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::operator[]
                    (local_18,local_20);
          VVar4 = trueValue((Literal *)0x24c487);
          puVar11 = bk_lib::pod_vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                              ((pod_vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_10
                               ,VVar7);
          *puVar11 = VVar4;
          local_20 = local_20 + 1;
        }
      }
      do {
        ppVar15 = local_10;
        this_00 = local_30;
        VVar8 = Literal::var(&local_34);
        puVar11 = bk_lib::pod_vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                            ((pod_vector<unsigned_char,_std::allocator<unsigned_char>_> *)ppVar15,
                             VVar8);
        VVar4 = *puVar11;
        VVar5 = trueValue((Literal *)0x24c502);
        if ((VVar4 != VVar5) && (bVar2)) {
          local_4c = 1;
          uVar9 = SatPreprocessor::Clause::size(this_00);
          for (; ppVar15 = local_10, local_4c != uVar9; local_4c = local_4c + 1) {
            pLVar10 = SatPreprocessor::Clause::operator[](this_00,local_4c);
            VVar8 = Literal::var(pLVar10);
            pbVar12 = bk_lib::pod_vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                                ((pod_vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                 ppVar15,VVar8);
            bVar1 = *pbVar12;
            SatPreprocessor::Clause::operator[](this_00,local_4c);
            bVar6 = falseValue((Literal *)0x24c5be);
            if ((bVar1 & 3) != bVar6) {
              pLVar10 = SatPreprocessor::Clause::operator[](this_00,local_4c);
              local_34.rep_ = pLVar10->rep_;
              break;
            }
          }
          SatPreprocessor::Clause::operator[](this_00,0);
          bVar3 = Clasp::operator==(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
          if (bVar3) {
            VVar4 = trueValue((Literal *)0x24c634);
            ppVar15 = local_10;
            VVar8 = Literal::var(&local_34);
            puVar11 = bk_lib::pod_vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                                ((pod_vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                 ppVar15,VVar8);
            *puVar11 = VVar4;
            bVar2 = false;
          }
        }
        local_30 = SatPreprocessor::Clause::next(local_30);
        uVar16 = false;
        if (local_30 != (Clause *)0x0) {
          pLVar10 = SatPreprocessor::Clause::operator[](local_30,0);
          local_34.rep_ = pLVar10->rep_;
          VVar8 = Literal::var(&local_34);
          uVar16 = VVar8 == VVar7;
        }
      } while ((bool)uVar16 != false);
      puVar11 = bk_lib::pod_vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                          ((pod_vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_10,
                           VVar7);
      if (*puVar11 == '\x04') {
        pbVar12 = bk_lib::pod_vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                            ((pod_vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_10,
                             VVar7);
        *pbVar12 = *pbVar12 | 1;
        in_stack_ffffffffffffff48 = local_18;
        posLit(0x24c724);
        bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::push_back
                  (in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
      }
    } while (local_30 != (Clause *)0x0);
    local_68 = bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::begin(local_18);
    uVar14 = (ulong)local_24;
    pLVar13 = bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::end(local_18);
    local_68 = local_68 + uVar14;
    local_60 = local_68;
    for (; local_68 != pLVar13; local_68 = local_68 + 1) {
      in_stack_ffffffffffffff40 = local_10;
      VVar7 = Literal::var(local_68);
      pbVar12 = bk_lib::pod_vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                          ((pod_vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                           in_stack_ffffffffffffff40,VVar7);
      if ((*pbVar12 & 4) != 0) {
        ppVar15 = local_10;
        VVar7 = Literal::var(local_68);
        puVar11 = bk_lib::pod_vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                            ((pod_vector<unsigned_char,_std::allocator<unsigned_char>_> *)ppVar15,
                             VVar7);
        *puVar11 = '\x01';
        local_60->rep_ = local_68->rep_;
        local_60 = local_60 + 1;
      }
    }
    bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::end(local_18);
    bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::erase
              ((pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_> *)
               CONCAT17(uVar16,in_stack_ffffffffffffff50),(iterator)in_stack_ffffffffffffff48,
               (iterator)in_stack_ffffffffffffff40);
  }
  return;
}

Assistant:

void SatElite::doExtendModel(ValueVec& m, LitVec& unconstr) {
	if (!elimTop_) return;
	const ValueRep value_eliminated = 4u;
	// compute values of eliminated vars / blocked literals by "unit propagating"
	// eliminated/blocked clauses in reverse order
	uint32 uv = 0;
	uint32 us = unconstr.size();
	Clause* r = elimTop_;
	do {
		Literal x  = (*r)[0];
		Var last   = x.var();
		bool check = true;
		if (!r->marked()) {
			// eliminated var - compute the implied value
			m[last] = value_eliminated;
		}
		if (uv != us && unconstr[uv].var() == last) {
			// last is unconstrained w.r.t the current model -
			// set remembered value
			check   = false;
			m[last] = trueValue(unconstr[uv]);
			++uv;
		}
		do {
			Clause& c = *r;
			if (m[x.var()] != trueValue(x) && check) {
				for (uint32 i = 1, end = c.size(); i != end; ++i) {
					ValueRep vi = m[c[i].var()] & 3u;
					if (vi != falseValue(c[i])) {
						x = c[i];
						break;
					}
				}
				if (x == c[0]) {
					// all lits != x are false
					// clause is unit or conflicting
					assert(c.marked() || m[x.var()] != falseValue(x));
					m[x.var()] = trueValue(x);
					check      = false;
				}
			}
			r = r->next();
		} while (r && (x = (*r)[0]).var() == last);
		if (m[last] == value_eliminated) {
			// last seems unconstrained w.r.t the model
			m[last] |= value_true;
			unconstr.push_back(posLit(last));
		}
	} while (r);
	// check whether newly added unconstrained vars are really unconstrained w.r.t the model
	// or if they are implied by some blocked clause.
	LitVec::iterator j = unconstr.begin()+us;
	for (LitVec::iterator it = j, end = unconstr.end(); it != end; ++it) {
		if ((m[it->var()] & value_eliminated) != 0) {
			// var is unconstrained - assign to true and remember it
			// so that we can later enumerate the model containing ~var
			m[it->var()] = value_true;
			*j++ = *it;
		}
	}
	unconstr.erase(j, unconstr.end());
}